

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_iterate(roaring_bitmap_t *r,roaring_iterator iterator,void *ptr)

{
  int iVar1;
  uint8_t uVar2;
  _Bool _Var3;
  long lVar4;
  bool bVar5;
  uint32_t base;
  array_container_t *cont;
  long lVar6;
  
  iVar1 = (r->high_low_container).size;
  bVar5 = iVar1 < 1;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      cont = (array_container_t *)(r->high_low_container).containers[lVar6];
      uVar2 = (r->high_low_container).typecodes[lVar6];
      if (uVar2 == '\x04') {
        uVar2 = *(uint8_t *)&cont->array;
        cont = *(array_container_t **)cont;
      }
      base = (uint)(r->high_low_container).keys[lVar6] << 0x10;
      if (uVar2 == '\x03') {
        _Var3 = run_container_iterate((run_container_t *)cont,base,iterator,ptr);
      }
      else if (uVar2 == '\x02') {
        _Var3 = array_container_iterate(cont,base,iterator,ptr);
      }
      else {
        _Var3 = bitset_container_iterate((bitset_container_t *)cont,base,iterator,ptr);
      }
      if (_Var3 == false) {
        return bVar5;
      }
      lVar6 = lVar6 + 1;
      lVar4 = (long)(r->high_low_container).size;
      bVar5 = lVar4 <= lVar6;
    } while (lVar6 < lVar4);
  }
  return bVar5;
}

Assistant:

bool roaring_iterate(const roaring_bitmap_t *r, roaring_iterator iterator,
                     void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate(ra->containers[i], ra->typecodes[i],
                               ((uint32_t)ra->keys[i]) << 16, iterator, ptr)) {
            return false;
        }
    return true;
}